

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall Function_Pool::FunctionPoolTask::~FunctionPoolTask(FunctionPoolTask *this)

{
  TaskProviderSingleton *in_RDI;
  
  ((_Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false> *)
  &(((__uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
      *)&(in_RDI->super_AbstractTaskProvider)._vptr_AbstractTaskProvider)->_M_t).
   super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
   .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>)->_M_head_impl =
       (OutputImageInfo *)&PTR__FunctionPoolTask_0029ea80;
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
               *)in_RDI);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
               *)in_RDI);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
               *)in_RDI);
  TaskProviderSingleton::~TaskProviderSingleton(in_RDI);
  return;
}

Assistant:

FunctionPoolTask::~FunctionPoolTask()
    {
    }